

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invalid_commandline_tests.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  Variable *pVVar4;
  TestEventListener *pTVar5;
  UnitTestSource *pUVar6;
  TestFlag *pTVar7;
  uint uVar8;
  unsigned_long *in_R9;
  AssertionResult iutest_ar;
  char *targv [2];
  int targc;
  allocator<char> local_3c1;
  AssertionResult local_3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  int local_37c;
  string local_378;
  undefined1 local_358 [32];
  char *local_338;
  undefined8 local_330;
  ios_base local_2d8 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [32];
  char *local_190;
  undefined8 local_188;
  ios_base local_130 [264];
  
  iutest::UnitTest::instance();
  pVVar4 = iutest::TestEnv::get_vars();
  pTVar5 = iutest::TestEventListeners::Release
                     (&pVVar4->m_event_listeners,(pVVar4->m_event_listeners).m_default_xml_generator
                     );
  if (pTVar5 != (TestEventListener *)0x0) {
    (*pTVar5->_vptr_TestEventListener[1])(pTVar5);
  }
  local_37c = 2;
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)*argv;
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x122123;
  pUVar6 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::Initialize(pUVar6);
  iutest::TestEnv::ParseCommandLine<char_const>(&local_37c,(char **)&local_398);
  iutest::TestEnv::LoadFlagFile();
  pUVar6 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar6);
  local_358._0_4_ = 2;
  iutest::internal::CmpHelperEQ<int,int>
            (&local_3c0,(internal *)"2","targc",local_358,&local_37c,(int *)in_R9);
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_358,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_358);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_190 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
    ;
    local_188 = 0x100000030;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b0,(Fixed *)local_358,false);
    if ((undefined1 *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_) != local_1b0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_),local_1b0._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_358);
    std::ios_base::~ios_base(local_2d8);
  }
  paVar1 = &local_3c0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    CONCAT71(local_3c0.m_message.field_2._M_allocated_capacity._1_7_,
                             local_3c0.m_message.field_2._M_local_buf[0]) + 1);
  }
  pTVar7 = iutest::TestFlag::GetInstance();
  uVar8 = pTVar7->m_test_flags & 0x1000000;
  local_3c0.m_message._M_string_length = 0;
  local_3c0.m_message.field_2._M_local_buf[0] = '\0';
  local_3c0.m_result = SUB41(uVar8 >> 0x18,0);
  local_3c0.m_message._M_dataplus._M_p = (pointer)paVar1;
  if (uVar8 == 0) {
    memset((iu_global_format_stringstream *)local_358,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_358);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_378,(internal *)&local_3c0,
               (AssertionResult *)"::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)",
               "false","true",(char *)in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,local_378._M_dataplus._M_p,&local_3c1);
    local_190 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
    ;
    local_188 = 0x100000032;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b0,(Fixed *)local_358,false);
    if ((undefined1 *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_) != local_1b0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_),local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_358);
    std::ios_base::~ios_base(local_2d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    CONCAT71(local_3c0.m_message.field_2._M_allocated_capacity._1_7_,
                             local_3c0.m_message.field_2._M_local_buf[0]) + 1);
  }
  pUVar6 = iutest::UnitTestSource::GetInstance();
  iVar3 = iutest::UnitTestSource::Run(pUVar6);
  uVar8 = (uint)(iVar3 != 0);
  if (iVar3 == 0) {
    local_37c = 2;
    local_398.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*argv;
    local_398.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x122182;
    pUVar6 = iutest::UnitTestSource::GetInstance();
    iutest::UnitTestSource::Initialize(pUVar6);
    iutest::TestEnv::ParseCommandLine<char_const>(&local_37c,(char **)&local_398);
    iutest::TestEnv::LoadFlagFile();
    pUVar6 = iutest::UnitTestSource::GetInstance();
    iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar6);
    local_358._0_4_ = 2;
    iutest::internal::CmpHelperEQ<int,int>
              (&local_3c0,(internal *)"2","targc",local_358,&local_37c,(int *)in_R9);
    if (local_3c0.m_result == false) {
      memset((iu_global_format_stringstream *)local_358,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_358);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,local_3c0.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_378);
      local_190 = 
      "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
      ;
      local_188 = 0x10000003b;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b0,(Fixed *)local_358,false);
      if ((undefined1 *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_) != local_1b0 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_),local_1b0._16_8_ + 1
                       );
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_358);
      std::ios_base::~ios_base(local_2d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c0.m_message._M_dataplus._M_p,
                      CONCAT71(local_3c0.m_message.field_2._M_allocated_capacity._1_7_,
                               local_3c0.m_message.field_2._M_local_buf[0]) + 1);
    }
    pTVar7 = iutest::TestFlag::GetInstance();
    uVar8 = pTVar7->m_test_flags & 0x1000000;
    local_3c0.m_message._M_string_length = 0;
    local_3c0.m_message.field_2._M_local_buf[0] = '\0';
    local_3c0.m_result = SUB41(uVar8 >> 0x18,0);
    local_3c0.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (uVar8 == 0) {
      memset((iu_global_format_stringstream *)local_358,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_358);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_378,(internal *)&local_3c0,
                 (AssertionResult *)
                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)","false","true",
                 (char *)in_R9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,local_378._M_dataplus._M_p,&local_3c1);
      local_190 = 
      "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
      ;
      local_188 = 0x10000003c;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b0,(Fixed *)local_358,false);
      if ((undefined1 *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_) != local_1b0 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_),local_1b0._16_8_ + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_358);
      std::ios_base::~ios_base(local_2d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c0.m_message._M_dataplus._M_p,
                      CONCAT71(local_3c0.m_message.field_2._M_allocated_capacity._1_7_,
                               local_3c0.m_message.field_2._M_local_buf[0]) + 1);
    }
    pUVar6 = iutest::UnitTestSource::GetInstance();
    iVar3 = iutest::UnitTestSource::Run(pUVar6);
    if (iVar3 == 0) {
      local_398.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_398.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_398.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar2 = local_358 + 0x10;
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"--iutest_random_seed","")
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"--iutest_repeat","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,"--iutest_stream_result_to","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,"--iutest_file_location","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,"--iutest_file_location=xxx","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"--iutest_print_time","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"--iutest_print_time=","")
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,"--iutest_catch_exceptions","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"--iutest_color","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"--iutest_color=hoge","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"--iutest_shuffle=1","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"--iutest_output","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,"--iutest_also_run_disabled_tests=1","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,"--iutest_list_tests=1","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,"--iutest_list_tests_with_where=1","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"--x","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      local_358._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"-x","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((pointer)local_358._0_8_ != pcVar2) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      pUVar6 = iutest::UnitTestSource::GetInstance();
      iutest::UnitTestSource::Initialize(pUVar6);
      iutest::TestEnv::ParseCommandLine<char>(&local_398);
      iutest::TestEnv::LoadFlagFile();
      pUVar6 = iutest::UnitTestSource::GetInstance();
      iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar6);
      local_1b0._0_4_ = 0x11;
      local_358._0_8_ =
           (long)local_398.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_398.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
      iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (&local_3c0,(internal *)"17u","vargv.size()",local_1b0,(uint *)local_358,in_R9);
      if (local_3c0.m_result == false) {
        memset((iu_global_format_stringstream *)local_1b0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1b0);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_358);
        iutest::detail::
        DefaultPrintTo<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (0,&local_398,local_358 + 0x10);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_358);
        std::ios_base::~ios_base(local_2d8);
        iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b0,&local_1d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_358,local_3c0.m_message._M_dataplus._M_p,
                   (allocator<char> *)&local_378);
        local_338 = 
        "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
        ;
        local_330 = 0x100000053;
        iutest::AssertionHelper::OnFixed((AssertionHelper *)local_358,(Fixed *)local_1b0,false);
        if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
          operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
        std::ios_base::~ios_base(local_130);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0.m_message._M_dataplus._M_p,
                        CONCAT71(local_3c0.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_3c0.m_message.field_2._M_local_buf[0]) + 1);
      }
      pTVar7 = iutest::TestFlag::GetInstance();
      uVar8 = pTVar7->m_test_flags & 0x1000000;
      local_3c0.m_message._M_string_length = 0;
      local_3c0.m_message.field_2._M_local_buf[0] = '\0';
      local_3c0.m_result = SUB41(uVar8 >> 0x18,0);
      local_3c0.m_message._M_dataplus._M_p = (pointer)paVar1;
      if (uVar8 == 0) {
        memset((iu_global_format_stringstream *)local_358,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_358);
        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                  (&local_378,(internal *)&local_3c0,
                   (AssertionResult *)
                   "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)","false","true",
                   (char *)in_R9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,local_378._M_dataplus._M_p,(allocator<char> *)&local_37c);
        local_190 = 
        "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
        ;
        local_188 = 0x100000054;
        iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b0,(Fixed *)local_358,false);
        if ((undefined1 *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_) != local_1b0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_),
                          local_1b0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_358);
        std::ios_base::~ios_base(local_2d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0.m_message._M_dataplus._M_p,
                        CONCAT71(local_3c0.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_3c0.m_message.field_2._M_local_buf[0]) + 1);
      }
      pUVar6 = iutest::UnitTestSource::GetInstance();
      iVar3 = iutest::UnitTestSource::Run(pUVar6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_398);
      if (iVar3 == 0) {
        puts("*** Successful ***");
        uVar8 = 0;
      }
      else {
        uVar8 = 1;
      }
    }
    else {
      uVar8 = 1;
    }
  }
  return uVar8;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    (void)argc;
#if defined(DISABLE_FALSE_POSITIVE_XML)
    // 実行対象テストがないので xml 出力しない
    ::iuutil::ReleaseDefaultXmlGenerator();
#endif

    {
        int targc = 2;
        DECAL_ARGV("--gtest_foo");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(2, targc);
#if !defined(IUTEST_USE_GTEST)
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));
#endif
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
#if !defined(IUTEST_USE_GTEST)
    {
        int targc = 2;
        DECAL_ARGV("--iutest_foo");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(2, targc);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_random_seed");
        vargv.push_back("--iutest_repeat");
        vargv.push_back("--iutest_stream_result_to");
        vargv.push_back("--iutest_file_location");
        vargv.push_back("--iutest_file_location=xxx");
        vargv.push_back("--iutest_print_time");
        vargv.push_back("--iutest_print_time=");
        vargv.push_back("--iutest_catch_exceptions");
        vargv.push_back("--iutest_color");
        vargv.push_back("--iutest_color=hoge");
        vargv.push_back("--iutest_shuffle=1");
        vargv.push_back("--iutest_output");
        vargv.push_back("--iutest_also_run_disabled_tests=1");
        vargv.push_back("--iutest_list_tests=1");
        vargv.push_back("--iutest_list_tests_with_where=1");
        vargv.push_back("--x");
        vargv.push_back("-x");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(17u, vargv.size()) << ::iutest::PrintToString(vargv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
#endif
    printf("*** Successful ***\n");
    return 0;
}